

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlDetectEncoding(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  uint uVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  int iVar6;
  xmlParserErrors code;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  void *implCtxt;
  uint uVar10;
  xmlCharEncConvImpl impl;
  xmlCharEncoding enc;
  char *name;
  long lVar11;
  long lStack_120;
  uint local_10c;
  xmlCharEncodingHandlerPtr handler;
  int inlen;
  xmlChar out [200];
  
  iVar6 = xmlParserGrow(ctxt);
  if (iVar6 < 0) {
    return;
  }
  pxVar4 = ctxt->input;
  pxVar5 = pxVar4->cur;
  if ((long)pxVar4->end - (long)pxVar5 < 4) {
    return;
  }
  uVar3 = pxVar4->flags;
  xVar1 = *pxVar5;
  if ((uVar3 & 1) != 0) {
    if (xVar1 != 0xef) {
      return;
    }
    if (pxVar5[1] != 0xbb) {
      return;
    }
    if (pxVar5[2] != 0xbf) {
      return;
    }
    pxVar4->cur = pxVar5 + 3;
    return;
  }
  if (xVar1 == 0xff) {
    if (pxVar5[1] != 0xfe) {
      return;
    }
    enc = XML_CHAR_ENCODING_UTF16LE;
    uVar10 = 4;
LAB_00143162:
    lStack_120 = 2;
LAB_00143165:
    pxVar4->cur = pxVar5 + lStack_120;
    lStack_120._0_4_ = uVar10;
  }
  else {
    if (xVar1 == '<') {
      if (pxVar5[1] != '\0') {
        return;
      }
      if ((ctxt->html != 0) || (pxVar5[2] != '\0')) {
        if (pxVar5[2] != '?') {
          return;
        }
        if (pxVar5[3] != '\0') {
          return;
        }
        enc = XML_CHAR_ENCODING_UTF16LE;
        lStack_120._0_4_ = 4;
        goto LAB_0014316d;
      }
      if (pxVar5[3] != '\0') {
        return;
      }
      enc = XML_CHAR_ENCODING_UCS4LE;
    }
    else {
      if (xVar1 == 'L') {
        if (ctxt->html != 0) {
          return;
        }
        if (pxVar5[1] != 'o') {
          return;
        }
        if (pxVar5[2] != 0xa7) {
          return;
        }
        if (pxVar5[3] != 0x94) {
          return;
        }
        pxVar4->flags = uVar3 | 8;
        code = xmlCreateCharEncodingHandler("IBM037",0,ctxt->convImpl,ctxt->convCtxt,&handler);
        if (code == XML_ERR_OK) {
          local_10c = 199;
          inlen = *(int *)&pxVar4->end - (int)pxVar4->cur;
          iVar6 = xmlEncInputChunk(handler,out,(int *)&local_10c,pxVar4->cur,&inlen);
          if (-1 < iVar6) {
            uVar7 = (ulong)(int)local_10c;
            out[uVar7] = '\0';
            for (lVar11 = 0; lVar11 < (int)uVar7; lVar11 = lVar11 + 1) {
              if (out[lVar11] == 'e') {
                iVar6 = xmlStrncmp(out + lVar11,"encoding",8);
                if (iVar6 == 0) {
                  uVar7 = lVar11 + 10;
                  goto LAB_001431d7;
                }
                uVar7 = (ulong)local_10c;
              }
              else if (out[lVar11] == '>') break;
            }
          }
LAB_001432a3:
          xmlCharEncCloseFunc(handler);
          impl = ctxt->convImpl;
          implCtxt = ctxt->convCtxt;
          name = "IBM037";
LAB_001432c5:
          code = xmlCreateCharEncodingHandler(name,0,impl,implCtxt,&handler);
          if (code == XML_ERR_OK) {
            xmlSwitchToEncoding(ctxt,handler);
            return;
          }
        }
        xmlFatalErr(ctxt,code,"detecting EBCDIC\n");
        return;
      }
      if (xVar1 == 0xef) {
        if (pxVar5[1] != 0xbb) {
          return;
        }
        if (pxVar5[2] != 0xbf) {
          return;
        }
        enc = XML_CHAR_ENCODING_UTF8;
        uVar10 = 2;
        lStack_120 = 3;
        goto LAB_00143165;
      }
      if (xVar1 == 0xfe) {
        if (pxVar5[1] != 0xff) {
          return;
        }
        enc = XML_CHAR_ENCODING_UTF16BE;
        uVar10 = 6;
        goto LAB_00143162;
      }
      if (xVar1 != '\0') {
        return;
      }
      if ((ctxt->html != 0) || (pxVar5[1] != '\0')) {
        if (pxVar5[1] != '<') {
          return;
        }
        if (pxVar5[2] != '\0') {
          return;
        }
        if (pxVar5[3] != '?') {
          return;
        }
        enc = XML_CHAR_ENCODING_UTF16BE;
        lStack_120._0_4_ = 6;
        goto LAB_0014316d;
      }
      if (pxVar5[2] != '\0') {
        return;
      }
      if (pxVar5[3] != '<') {
        return;
      }
      enc = XML_CHAR_ENCODING_UCS4BE;
    }
    lStack_120._0_4_ = 8;
  }
LAB_0014316d:
  pxVar4->flags = (uint)lStack_120 | uVar3;
  xmlSwitchEncoding(ctxt,enc);
  return;
LAB_001431d7:
  uVar8 = (ulong)out[uVar7 - 2];
  if (0x3d < uVar8) goto LAB_001432a3;
  if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
    if (uVar8 == 0x3d) goto LAB_001431fc;
    goto LAB_001432a3;
  }
  uVar7 = uVar7 + 1;
  goto LAB_001431d7;
LAB_001431fc:
  uVar8 = (ulong)out[uVar7 - 1];
  if (uVar8 < 0x28) {
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0) goto code_r0x00143212;
    if ((0x8400000000U >> (uVar8 & 0x3f) & 1) != 0) {
      uVar9 = (ulong)(int)uVar7;
      uVar8 = uVar7 & 0xffffffff;
      while (((bVar2 = out[uVar8], (byte)(bVar2 - 0x30) < 10 ||
              ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) ||
             ((bVar2 - 0x2d < 0x33 &&
              ((0x4000000000003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) != 0))))) {
        uVar9 = uVar9 + 1;
        uVar8 = uVar9;
      }
      if (bVar2 != out[uVar7 - 1]) goto LAB_001432a3;
      out[uVar9 & 0xffffffff] = '\0';
      xmlCharEncCloseFunc(handler);
      name = (char *)(out + (uVar7 & 0xffffffff));
      impl = ctxt->convImpl;
      implCtxt = ctxt->convCtxt;
      goto LAB_001432c5;
    }
  }
  goto LAB_001432a3;
code_r0x00143212:
  uVar7 = uVar7 + 1;
  goto LAB_001431fc;
}

Assistant:

void
xmlDetectEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    xmlCharEncoding enc;
    int bomSize;
    int autoFlag = 0;

    if (xmlParserGrow(ctxt) < 0)
        return;
    in = ctxt->input->cur;
    if (ctxt->input->end - in < 4)
        return;

    if (ctxt->input->flags & XML_INPUT_HAS_ENCODING) {
        /*
         * If the encoding was already set, only skip the BOM which was
         * possibly decoded to UTF-8.
         */
        if ((in[0] == 0xEF) && (in[1] == 0xBB) && (in[2] == 0xBF)) {
            ctxt->input->cur += 3;
        }

        return;
    }

    enc = XML_CHAR_ENCODING_NONE;
    bomSize = 0;

    /*
     * BOM sniffing and detection of initial bytes of an XML
     * declaration.
     *
     * The HTML5 spec doesn't cover UTF-32 (UCS-4) or EBCDIC.
     */
    switch (in[0]) {
        case 0x00:
            if ((!ctxt->html) &&
                (in[1] == 0x00) && (in[2] == 0x00) && (in[3] == 0x3C)) {
                enc = XML_CHAR_ENCODING_UCS4BE;
                autoFlag = XML_INPUT_AUTO_OTHER;
            } else if ((in[1] == 0x3C) && (in[2] == 0x00) && (in[3] == 0x3F)) {
                /*
                 * TODO: The HTML5 spec requires to check that the
                 * next codepoint is an 'x'.
                 */
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
            }
            break;

        case 0x3C:
            if (in[1] == 0x00) {
                if ((!ctxt->html) &&
                    (in[2] == 0x00) && (in[3] == 0x00)) {
                    enc = XML_CHAR_ENCODING_UCS4LE;
                    autoFlag = XML_INPUT_AUTO_OTHER;
                } else if ((in[2] == 0x3F) && (in[3] == 0x00)) {
                    /*
                     * TODO: The HTML5 spec requires to check that the
                     * next codepoint is an 'x'.
                     */
                    enc = XML_CHAR_ENCODING_UTF16LE;
                    autoFlag = XML_INPUT_AUTO_UTF16LE;
                }
            }
            break;

        case 0x4C:
	    if ((!ctxt->html) &&
                (in[1] == 0x6F) && (in[2] == 0xA7) && (in[3] == 0x94)) {
	        enc = XML_CHAR_ENCODING_EBCDIC;
                autoFlag = XML_INPUT_AUTO_OTHER;
            }
            break;

        case 0xEF:
            if ((in[1] == 0xBB) && (in[2] == 0xBF)) {
                enc = XML_CHAR_ENCODING_UTF8;
                autoFlag = XML_INPUT_AUTO_UTF8;
                bomSize = 3;
            }
            break;

        case 0xFE:
            if (in[1] == 0xFF) {
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
                bomSize = 2;
            }
            break;

        case 0xFF:
            if (in[1] == 0xFE) {
                enc = XML_CHAR_ENCODING_UTF16LE;
                autoFlag = XML_INPUT_AUTO_UTF16LE;
                bomSize = 2;
            }
            break;
    }

    if (bomSize > 0) {
        ctxt->input->cur += bomSize;
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        ctxt->input->flags |= autoFlag;

        if (enc == XML_CHAR_ENCODING_EBCDIC) {
            xmlCharEncodingHandlerPtr handler;
            int res;

            res = xmlDetectEBCDIC(ctxt, &handler);
            if (res != XML_ERR_OK) {
                xmlFatalErr(ctxt, res, "detecting EBCDIC\n");
            } else {
                xmlSwitchToEncoding(ctxt, handler);
            }
        } else {
            xmlSwitchEncoding(ctxt, enc);
        }
    }
}